

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

ostream * __thiscall
pstack::Procman::Process::dumpStackText(Process *this,ostream *os,ThreadStack *thread)

{
  bool bVar1;
  ostream *poVar2;
  reference frame_00;
  StackFrame *frame;
  const_iterator __end2;
  const_iterator __begin2;
  vector<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_> *__range2;
  int frameNo;
  ThreadStack *thread_local;
  ostream *os_local;
  Process *this_local;
  
  std::ostream::operator<<(os,std::dec);
  poVar2 = std::operator<<(os,"thread: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(void *)(thread->info).ti_tid);
  poVar2 = std::operator<<(poVar2,", lwp: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(thread->info).ti_lid);
  poVar2 = std::operator<<(poVar2,", type: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(thread->info).ti_type);
  std::operator<<(poVar2,"\n");
  __range2._4_4_ = 0;
  __end2 = std::vector<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>::
           begin(&thread->stack);
  frame = (StackFrame *)
          std::vector<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>::
          end(&thread->stack);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_pstack::Procman::StackFrame_*,_std::vector<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>_>
                      (&__end2,(__normal_iterator<const_pstack::Procman::StackFrame_*,_std::vector<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>_>
                                *)&frame);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    frame_00 = __gnu_cxx::
               __normal_iterator<const_pstack::Procman::StackFrame_*,_std::vector<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>_>
               ::operator*(&__end2);
    dumpFrameText(this,os,frame_00,__range2._4_4_);
    __gnu_cxx::
    __normal_iterator<const_pstack::Procman::StackFrame_*,_std::vector<pstack::Procman::StackFrame,_std::allocator<pstack::Procman::StackFrame>_>_>
    ::operator++(&__end2);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  return os;
}

Assistant:

std::ostream &
Process::dumpStackText(std::ostream &os, const ThreadStack &thread)
{
    os << std::dec;
    os << "thread: " << (void *)thread.info.ti_tid << ", lwp: "
       << thread.info.ti_lid << ", type: " << thread.info.ti_type << "\n";
    int frameNo = 0;
    for (auto &frame : thread.stack)
        dumpFrameText(os, frame, frameNo++);
    return os;
}